

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_teleport(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  long lVar3;
  ROOM_INDEX_DATA *unaff_R15;
  
  if (*(long *)((long)vo + 0xa8) != 0) {
    bVar1 = is_npc(ch);
    if ((bVar1) || ((*(byte *)(*(long *)((long)vo + 0xa8) + 0x141) & 0x20) == 0)) {
      if ((CHAR_DATA *)vo == ch) {
LAB_0030a70e:
        if (*(short *)(*(long *)(*(long *)((long)vo + 0xa8) + 0x30) + 0x5c) != 5) {
          bVar1 = is_affected_room(ch->in_room,(int)gsn_plasma_cube);
          if (bVar1) {
            iVar2 = number_percent();
            if (iVar2 < 0x32) goto LAB_0030a720;
          }
          bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_bind_feet);
          if (!bVar1) {
            lVar3 = 9999;
            while (bVar1 = lVar3 != 0, lVar3 = lVar3 + -1, bVar1) {
              unaff_R15 = get_random_room((CHAR_DATA *)vo);
              if ((unaff_R15 != (ROOM_INDEX_DATA *)0x0) &&
                 ((unaff_R15->room_flags[0] & 0x102000) == 0)) {
                bVar1 = is_explore(unaff_R15);
                if ((!bVar1) &&
                   ((unaff_R15->cabal == 0 &&
                    (1 < (ushort)((short)*(undefined4 *)&unaff_R15->area->area_type - 5U))))) {
                  bVar1 = is_adjacent_area(ch->in_room->area,unaff_R15->area);
                  if ((bVar1) || (ch->in_room->area == unaff_R15->area)) break;
                }
              }
            }
            if ((CHAR_DATA *)vo != ch) {
              send_to_char("You have been teleported!\n\r",(CHAR_DATA *)vo);
            }
            un_watermeld((CHAR_DATA *)vo,(char *)0x0);
            act("$n vanishes!",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
            char_from_room((CHAR_DATA *)vo);
            char_to_room((CHAR_DATA *)vo,unaff_R15);
            act("$n slowly fades into existence.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
            un_blade_barrier(ch,(char *)0x0);
            un_watermeld(ch,(char *)0x0);
            do_look((CHAR_DATA *)vo,"auto");
            check_plasma_thread((CHAR_DATA *)vo,-1);
            return;
          }
          txt = "Your feet are rooted to the ground!\n\r";
          ch = (CHAR_DATA *)vo;
          goto LAB_0030a72a;
        }
      }
      else if ((*(byte *)((long)vo + 0x1b0) & 1) == 0) {
        bVar1 = is_immortal(ch);
        if (bVar1) goto LAB_0030a70e;
      }
    }
  }
LAB_0030a720:
  txt = "You failed.\n\r";
LAB_0030a72a:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_teleport(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	ROOM_INDEX_DATA *pRoomIndex;
	long nocrash; /* Infinite loops = bad mojo */

	if (victim->in_room == nullptr
		|| (!is_npc(ch) && IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL))
		|| (victim != ch && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (victim != ch && !is_immortal(ch))
		|| (victim->in_room->area->area_type == ARE_UNOPENED)
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", victim);
		return;
	}

	for (nocrash = 1; nocrash < 10000; nocrash++)
	{
		pRoomIndex = get_random_room(victim);
		if(pRoomIndex == nullptr)
		{
			continue; // this prevents us from evaluating rooms that don't exist due to our
			// lovely method of getting a "random" room.
		}
		if (!IS_SET(pRoomIndex->room_flags, ROOM_NO_RECALL)
			&& !IS_SET(pRoomIndex->room_flags, ROOM_NO_GATE)
			&& !is_explore(pRoomIndex)
			&& !pRoomIndex->cabal
			&& pRoomIndex->area->area_type != ARE_UNOPENED
			&& pRoomIndex->area->area_type != ARE_SHRINE
			&& (is_adjacent_area(ch->in_room->area, pRoomIndex->area) || (ch->in_room->area == pRoomIndex->area)))
		{
			break;
		}
	}

	/*
	 * If there's no valid place to tele to, they stay put.  Better than
	 * an infinite loop -- El
	 */
	if (nocrash >= 1000000)
		pRoomIndex = victim->in_room;

	if (victim != ch)
		send_to_char("You have been teleported!\n\r", victim);

	un_watermeld(victim, nullptr);

	act("$n vanishes!", victim, nullptr, nullptr, TO_ROOM);

	char_from_room(victim);
	char_to_room(victim, pRoomIndex);

	act("$n slowly fades into existence.", victim, nullptr, nullptr, TO_ROOM);

	un_blade_barrier(ch, nullptr);
	un_watermeld(ch, nullptr);

	do_look(victim, "auto");
	check_plasma_thread(victim, -1);
}